

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

void __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>>::
Unarchive(FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>> *this)

{
  MemIOReader *in_RSI;
  
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::Unarchive
            ((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_> *)
             (this + -0x38),in_RSI);
  return;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }